

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_168::BestCastFinder::updateBestCast
          (BestCastFinder *this,Expression *curr,Index index)

{
  Type left;
  Type right;
  bool bVar1;
  mapped_type *ppEVar2;
  Index local_1c [2];
  Index index_local;
  
  local_1c[0] = index;
  ppEVar2 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->mostCastedGets,local_1c);
  if (*ppEVar2 != (mapped_type)0x0) {
    left.id = (curr->type).id;
    right.id = ((*ppEVar2)->type).id;
    if (left.id == right.id) {
      return;
    }
    bVar1 = wasm::Type::isSubType(left,right);
    if (!bVar1) {
      return;
    }
  }
  *ppEVar2 = curr;
  return;
}

Assistant:

void updateBestCast(Expression* curr, Index index) {
    auto*& bestCast = mostCastedGets[index];
    if (!bestCast) {
      // This is the first.
      bestCast = curr;
      return;
    }

    // See if we are better than the current best.
    if (curr->type != bestCast->type &&
        Type::isSubType(curr->type, bestCast->type)) {
      bestCast = curr;
    }
  }